

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O0

void __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::SmallHeapBlockT
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this,HeapBucket *bucket,
          ushort objectSize,ushort objectCount,HeapBlockType heapBlockType)

{
  uint uVar1;
  ValidPointers<SmallAllocationBlockAttributes> VVar2;
  HeapBlockType heapBlockType_local;
  ushort objectCount_local;
  ushort objectSize_local;
  HeapBucket *bucket_local;
  SmallHeapBlockT<SmallAllocationBlockAttributes> *this_local;
  
  HeapBlock::HeapBlock(&this->super_HeapBlock,heapBlockType);
  (this->super_HeapBlock)._vptr_HeapBlock = (_func_int **)&PTR_WBSetBit_0047e4e8;
  uVar1 = HeapInfo::GetBucketIndex((ulong)objectSize);
  VVar2 = HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::GetValidPointersForIndex
                    (&HeapInfo::smallAllocValidPointersMap,uVar1);
  this->validPointers = VVar2;
  uVar1 = HeapInfo::GetBucketIndex((ulong)objectSize);
  this->bucketIndex = uVar1;
  this->objectSize = objectSize;
  this->objectCount = objectCount;
  BVStatic<256UL>::BVStatic(&this->freeBits);
  BVStatic<512UL>::BVStatic(&this->wbVerifyBits);
  BVStatic<256UL>::BVStatic(&this->debugFreeBits);
  BVStatic<256UL>::BVStatic(&this->explicitFreeBits);
  ConstructorCommon(this,bucket,objectSize,objectCount,heapBlockType);
  return;
}

Assistant:

SmallHeapBlockT<TBlockAttributes>::SmallHeapBlockT(HeapBucket * bucket, ushort objectSize, ushort objectCount, HeapBlockType heapBlockType)
    : HeapBlock(heapBlockType),
    bucketIndex(HeapInfo::GetBucketIndex(objectSize)),
    validPointers(HeapInfo::smallAllocValidPointersMap.GetValidPointersForIndex(HeapInfo::GetBucketIndex(objectSize))),
    objectSize(objectSize), objectCount(objectCount)
{
    ConstructorCommon(bucket, objectSize, objectCount, heapBlockType);
}